

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int luv_udp_recv_start(lua_State *L)

{
  uint status;
  uv_udp_t *handle;
  int iVar1;
  int in_ESI;
  
  handle = luv_check_udp(L,in_ESI);
  iVar1 = 1;
  luv_check_callback(L,(luv_handle_t *)handle->data,1,2);
  status = uv_udp_recv_start(handle,luv_alloc_cb,luv_udp_recv_cb);
  if ((int)status < 0) {
    luv_error(L,status);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(ulong)status);
  }
  return iVar1;
}

Assistant:

static int luv_udp_recv_start(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_RECV, 2);
  ret = uv_udp_recv_start(handle, luv_alloc_cb, luv_udp_recv_cb);
#if LUV_UV_VERSION_LEQ(1, 23, 0)
  // in Libuv <= 1.23.0, uv_udp_recv_start will return untranslated error codes on Windows
  ret = uv_translate_sys_error(ret);
#endif
  return luv_result(L, ret);
}